

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O0

void client(void *arg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_2c;
  int cli_sock;
  int i;
  size_t sz_msg;
  char msg [3];
  void *pvStack_18;
  int bytes;
  intptr_t id;
  void *arg_local;
  
  sz_msg._1_1_ = (char)((long)arg % 0x1a) + 'A';
  sz_msg._2_1_ = 'a';
  sz_msg._3_1_ = 0;
  pvStack_18 = arg;
  sVar3 = strlen((char *)((long)&sz_msg + 1));
  local_2c = 0;
  while( true ) {
    if (9 < local_2c) {
      return;
    }
    iVar1 = nn_socket(1,0x50);
    sz_msg._2_1_ = (char)(local_2c % 0x1a) + 'a';
    if (iVar1 < 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","cli_sock >= 0",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x5b);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_connect(iVar1,"ipc://test-stress.ipc");
    if (iVar2 < 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_connect (cli_sock, SOCKET_ADDRESS) >= 0",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x5c);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_sleep(0x32);
    sz_msg._4_4_ = nn_send(iVar1,(long)&sz_msg + 1,sVar3 + 1,0);
    nn_sleep(100);
    if ((long)sz_msg._4_4_ != sVar3 + 1) break;
    nn_close(iVar1);
    local_2c = local_2c + 1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","(size_t)bytes == sz_msg",
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c",
          0x62);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    size_t sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    /*  '\0' too */
    sz_msg = strlen (msg) + 1;

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket (AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert (cli_sock >= 0);
        nn_assert (nn_connect (cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep (50);
        bytes = nn_send (cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep (100);
        nn_assert ((size_t)bytes == sz_msg);
        nn_close (cli_sock);
    }
}